

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::Hashing::compute_hash_compute_pipeline
               (StateRecorder *recorder,VkComputePipelineCreateInfo *create_info,Hash *out_hash)

{
  VkSpecializationInfo *spec;
  bool bVar1;
  uint uVar2;
  VkPipelineCreateFlags2CreateInfo *pVVar3;
  VkShaderModuleCreateInfo *create_info_00;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *info;
  ulong uVar4;
  VkPipelineLayout layout;
  VkShaderModule module;
  VkStructureType sType;
  Hash hash;
  ulong local_40;
  Hasher local_38;
  
  if ((create_info->stage).pName != (char *)0x0) {
    layout = create_info->layout;
    bVar1 = StateRecorder::get_hash_for_pipeline_layout(recorder,layout,&local_40);
    if (!bVar1) {
      return false;
    }
    uVar4 = (local_40 & 0xffffffff ^ 0xaf63bd4c8601b7df) * 0x100000001b3 ^ local_40 >> 0x20;
    pVVar3 = find_pnext<VkPipelineCreateFlags2CreateInfo>
                       ((VkStructureType)create_info->pNext,layout);
    if (pVVar3 == (VkPipelineCreateFlags2CreateInfo *)0x0) {
      uVar2 = create_info->flags;
      uVar4 = uVar4 * 0x100000001b3 ^ (ulong)(uVar2 & 0x7ffffc3f);
    }
    else {
      uVar4 = uVar4 * 0x100000001b3;
      uVar2 = create_info->flags;
    }
    if (((uVar2 & 4) == 0) || (create_info->basePipelineHandle == (VkPipeline)0x0)) {
      uVar4 = uVar4 * 0x100000001b3;
    }
    else {
      bVar1 = StateRecorder::get_hash_for_compute_pipeline_handle
                        (recorder,create_info->basePipelineHandle,&local_40);
      if (!bVar1) {
        return false;
      }
      uVar4 = ((local_40 & 0xffffffff ^ uVar4 * 0x100000001b3) * 0x100000001b3 ^ local_40 >> 0x20) *
              0x100000001b3 ^ (ulong)(uint)create_info->basePipelineIndex;
    }
    module = (create_info->stage).module;
    if (module == (VkShaderModule)0x0) {
      sType = (VkStructureType)(create_info->stage).pNext;
      create_info_00 = find_pnext<VkShaderModuleCreateInfo>(sType,(void *)0x0);
      if (create_info_00 != (VkShaderModuleCreateInfo *)0x0) {
        compute_hash_shader_module(create_info_00,&local_40);
        goto LAB_001086d9;
      }
      info = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(sType,module);
      if (info == (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) {
        return false;
      }
      bVar1 = StateRecorder::get_hash_for_shader_module(recorder,info,&local_40);
    }
    else {
      bVar1 = StateRecorder::get_hash_for_shader_module(recorder,module,&local_40);
    }
    if (bVar1 != false) {
LAB_001086d9:
      local_38.h = (local_40 & 0xffffffff ^ uVar4 * 0x100000001b3) * 0x100000001b3 ^
                   local_40 >> 0x20;
      Hasher::string(&local_38,(create_info->stage).pName);
      local_38.h = (local_38.h * 0x100000001b3 ^ (ulong)(create_info->stage).flags) * 0x100000001b3
                   ^ (ulong)(create_info->stage).stage;
      spec = (create_info->stage).pSpecializationInfo;
      if (spec == (VkSpecializationInfo *)0x0) {
        local_38.h = local_38.h * 0x100000001b3;
      }
      else {
        hash_specialization_info(&local_38,spec);
      }
      bVar1 = hash_pnext_chain(recorder,&local_38,(create_info->stage).pNext,(DynamicStateInfo *)0x0
                               ,0);
      if (bVar1) {
        bVar1 = hash_pnext_chain(recorder,&local_38,create_info->pNext,(DynamicStateInfo *)0x0,0);
        if (bVar1) {
          *out_hash = local_38.h;
          return true;
        }
        return false;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool compute_hash_compute_pipeline(const StateRecorder &recorder, const VkComputePipelineCreateInfo &create_info, Hash *out_hash)
{
	// Ignore pipelines that cannot result in meaningful replay.
	if (!create_info.stage.pName)
		return false;

	Hasher h;
	Hash hash;

	if (!recorder.get_hash_for_pipeline_layout(create_info.layout, &hash))
		return false;
	h.u64(hash);

	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, create_info.pNext))
		h.u32(0);
	else
		h.u32(normalize_pipeline_creation_flags(create_info.flags));

	if ((create_info.flags & VK_PIPELINE_CREATE_DERIVATIVE_BIT) != 0 &&
	    create_info.basePipelineHandle != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_compute_pipeline_handle(create_info.basePipelineHandle, &hash))
			return false;
		h.u64(hash);
		h.s32(create_info.basePipelineIndex);
	}
	else
		h.u32(0);

	// Unfortunately, the hash order is incompatible with compute_hash_stage().
	// For compatibility, cannot change this without a clean break.
	if (create_info.stage.module != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_shader_module(create_info.stage.module, &hash))
			return false;
	}
	else if (const auto *module = find_pnext<VkShaderModuleCreateInfo>(
			VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO, create_info.stage.pNext))
	{
		if (!compute_hash_shader_module(*module, &hash))
			return false;
	}
	else if (const auto *identifier = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT, create_info.stage.pNext))
	{
		if (!recorder.get_hash_for_shader_module(identifier, &hash))
			return false;
	}
	else
		return false;

	h.u64(hash);

	h.string(create_info.stage.pName);
	h.u32(create_info.stage.flags);
	h.u32(create_info.stage.stage);

	if (create_info.stage.pSpecializationInfo)
		hash_specialization_info(h, *create_info.stage.pSpecializationInfo);
	else
		h.u32(0);

	if (!hash_pnext_chain(&recorder, h, create_info.stage.pNext, nullptr, 0))
		return false;

	if (!hash_pnext_chain(&recorder, h, create_info.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}